

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int save_xattrs(archive_write *a,file_conflict *file)

{
  void *buff;
  void *pvVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  heap_data *__ptr;
  size_t size;
  void *value;
  char *name;
  size_t local_a8;
  void *local_a0;
  chksumwork_conflict *local_98;
  code *local_90;
  code *local_88;
  archive_md5_ctx *local_80;
  archive_sha1_ctx *local_78;
  wchar_t local_6c;
  archive_md5_ctx *local_68;
  archive_sha1_ctx *local_60;
  code *local_58;
  code *local_50;
  long local_48;
  chksumwork_conflict *local_40;
  char *local_38;
  
  pvVar1 = a->format_data;
  wVar2 = archive_entry_xattr_reset(file->entry);
  if (wVar2 != L'\0') {
    local_98 = (chksumwork_conflict *)((long)pvVar1 + 0x98);
    local_50 = __archive_sha1init;
    local_78 = (archive_sha1_ctx *)((long)pvVar1 + 0xa8);
    local_58 = __archive_md5init;
    local_88 = __archive_md5update;
    local_80 = (archive_md5_ctx *)((long)pvVar1 + 0xa0);
    local_40 = (chksumwork_conflict *)((long)pvVar1 + 0xb0);
    local_60 = (archive_sha1_ctx *)((long)pvVar1 + 0xc0);
    local_68 = (archive_md5_ctx *)((long)pvVar1 + 0xb8);
    local_90 = __archive_sha1update;
    local_48 = (long)pvVar1 + 200;
    buff = (void *)((long)pvVar1 + 0x120);
    do {
      archive_entry_xattr_next(file->entry,&local_38,&local_a0,&local_a8);
      iVar3 = *(int *)((long)pvVar1 + 0x84);
      *(int *)((long)pvVar1 + 0x98) = iVar3;
      if (iVar3 == 2) {
        (*local_58)(local_80);
      }
      else if (iVar3 == 1) {
        (*local_50)(local_78);
      }
      iVar3 = *(int *)((long)pvVar1 + 0x84);
      *(int *)((long)pvVar1 + 0xb0) = iVar3;
      local_6c = wVar2;
      if (iVar3 == 2) {
        (*local_58)(local_68);
      }
      else if (iVar3 == 1) {
        (*local_50)(local_60);
      }
      __ptr = (heap_data *)calloc(1,0x80);
      if (__ptr == (heap_data *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for xattr");
        return -0x1e;
      }
      iVar3 = file->ea_idx;
      file->ea_idx = iVar3 + 1;
      __ptr->id = iVar3;
      __ptr->temp_offset = *(uint64_t *)((long)pvVar1 + 8);
      __ptr->size = local_a8;
      __ptr->compression = *(enctype *)((long)pvVar1 + 0x88);
      if (*(int *)((long)pvVar1 + 0xb0) == 2) {
        (*local_88)(local_68,local_a0,local_a8);
      }
      else if (*(int *)((long)pvVar1 + 0xb0) == 1) {
        (*local_90)(local_60,local_a0,local_a8);
      }
      checksum_final(local_40,&__ptr->e_sum);
      if (__ptr->compression == NONE) {
        if (local_98->alg == CKSUM_MD5) {
          (*local_88)(local_80,local_a0,local_a8);
        }
        else if (local_98->alg == CKSUM_SHA1) {
          (*local_90)(local_78,local_a0,local_a8);
        }
        checksum_final(local_98,&__ptr->a_sum);
        iVar3 = write_to_temp(a,local_a0,local_a8);
        if (iVar3 != 0) goto LAB_0017dbc9;
        __ptr->length = local_a8;
        __ptr->next = (heap_data *)0x0;
        *(file->xattr).last = __ptr;
        (file->xattr).last = &__ptr->next;
      }
      else {
        iVar3 = xar_compression_init_encoder(a);
        if (iVar3 != 0) {
LAB_0017dbc9:
          free(__ptr);
          return -0x1e;
        }
        *(void **)((long)pvVar1 + 200) = local_a0;
        *(size_t *)((long)pvVar1 + 0xd0) = local_a8;
        while( true ) {
          if (*(int *)((long)pvVar1 + 0xf8) == 0) {
            uVar4 = 0;
          }
          else {
            uVar4 = (**(code **)((long)pvVar1 + 0x108))(a,local_48,0);
          }
          if (1 < uVar4) goto LAB_0017dbc9;
          local_a8 = 0x10000 - *(long *)((long)pvVar1 + 0xe8);
          if (*(int *)((long)pvVar1 + 0x98) == 2) {
            (*local_88)(local_80,buff,local_a8);
          }
          else if (*(int *)((long)pvVar1 + 0x98) == 1) {
            (*local_90)(local_78,buff,local_a8);
          }
          iVar3 = write_to_temp(a,buff,local_a8);
          if (iVar3 != 0) goto LAB_0017dbc9;
          if (uVar4 != 0) break;
          *(void **)((long)pvVar1 + 0xe0) = buff;
          *(undefined8 *)((long)pvVar1 + 0xe8) = 0x10000;
        }
        checksum_final(local_98,&__ptr->a_sum);
        __ptr->length = *(uint64_t *)((long)pvVar1 + 0xf0);
        __ptr->next = (heap_data *)0x0;
        *(file->xattr).last = __ptr;
        (file->xattr).last = &__ptr->next;
        if ((*(int *)((long)pvVar1 + 0xf8) != 0) &&
           (iVar3 = (**(code **)((long)pvVar1 + 0x110))(a,local_48), iVar3 != 0)) {
          return -0x1e;
        }
      }
      wVar2 = local_6c + L'\xffffffff';
    } while (wVar2 != L'\0');
  }
  return 0;
}

Assistant:

static int
save_xattrs(struct archive_write *a, struct file *file)
{
	struct xar *xar;
	const char *name;
	const void *value;
	struct heap_data *heap;
	size_t size;
	int count, r;

	xar = (struct xar *)a->format_data;
	count = archive_entry_xattr_reset(file->entry);
	if (count == 0)
		return (ARCHIVE_OK);
	while (count--) {
		archive_entry_xattr_next(file->entry,
		    &name, &value, &size);
		checksum_init(&(xar->a_sumwrk), xar->opt_sumalg);
		checksum_init(&(xar->e_sumwrk), xar->opt_sumalg);

		heap = calloc(1, sizeof(*heap));
		if (heap == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for xattr");
			return (ARCHIVE_FATAL);
		}
		heap->id = file->ea_idx++;
		heap->temp_offset = xar->temp_offset;
		heap->size = size;/* save a extracted size */
		heap->compression = xar->opt_compression;
		/* Get a extracted sumcheck value. */
		checksum_update(&(xar->e_sumwrk), value, size);
		checksum_final(&(xar->e_sumwrk), &(heap->e_sum));

		/*
		 * Not compression to xattr is simple way.
		 */
		if (heap->compression == NONE) {
			checksum_update(&(xar->a_sumwrk), value, size);
			checksum_final(&(xar->a_sumwrk), &(heap->a_sum));
			if (write_to_temp(a, value, size)
			    != ARCHIVE_OK) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			heap->length = size;
			/* Add heap to the tail of file->xattr. */
			heap->next = NULL;
			*file->xattr.last = heap;
			file->xattr.last = &(heap->next);
			/* Next xattr */
			continue;
		}

		/*
		 * Init compression library.
		 */
		r = xar_compression_init_encoder(a);
		if (r != ARCHIVE_OK) {
			free(heap);
			return (ARCHIVE_FATAL);
		}

		xar->stream.next_in = (const unsigned char *)value;
		xar->stream.avail_in = size;
		for (;;) {
			r = compression_code(&(a->archive),
			    &(xar->stream), ARCHIVE_Z_FINISH);
			if (r != ARCHIVE_OK && r != ARCHIVE_EOF) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			size = sizeof(xar->wbuff) - xar->stream.avail_out;
			checksum_update(&(xar->a_sumwrk),
			    xar->wbuff, size);
			if (write_to_temp(a, xar->wbuff, size)
			    != ARCHIVE_OK) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			if (r == ARCHIVE_OK) {
				xar->stream.next_out = xar->wbuff;
				xar->stream.avail_out = sizeof(xar->wbuff);
			} else {
				checksum_final(&(xar->a_sumwrk),
				    &(heap->a_sum));
				heap->length = xar->stream.total_out;
				/* Add heap to the tail of file->xattr. */
				heap->next = NULL;
				*file->xattr.last = heap;
				file->xattr.last = &(heap->next);
				break;
			}
		}
		/* Clean up compression library. */
		r = compression_end(&(a->archive), &(xar->stream));
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}